

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateVirtualTableAssignment
          (ExpressionContext *ctx,SynBase *source,VariableData *vtable,TypeBase *type,
          FunctionData *function)

{
  TypeBase *pTVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar5;
  ExprBase *lhs;
  TypeRef *pTVar6;
  ExprBase *rhs;
  undefined4 extraout_var_04;
  undefined8 *puVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
  ExprVariableAccess::ExprVariableAccess
            ((ExprVariableAccess *)CONCAT44(extraout_var,iVar2),source,vtable->type,vtable);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
  puVar4 = (undefined8 *)CONCAT44(extraout_var_00,iVar3);
  pTVar1 = ctx->typeTypeID;
  *(undefined4 *)(puVar4 + 1) = 8;
  puVar4[2] = source;
  puVar4[3] = pTVar1;
  puVar4[4] = 0;
  *(undefined1 *)(puVar4 + 5) = 0;
  *puVar4 = &PTR__ExprBase_00240550;
  puVar4[6] = type;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  puVar5 = (undefined8 *)CONCAT44(extraout_var_01,iVar3);
  pTVar1 = ctx->typeInt;
  *(undefined4 *)(puVar5 + 1) = 0x12;
  puVar5[2] = source;
  puVar5[3] = pTVar1;
  puVar5[4] = 0;
  *(undefined1 *)(puVar5 + 5) = 0;
  *puVar5 = &PTR__ExprBase_002409d8;
  puVar5[6] = puVar4;
  *(undefined4 *)(puVar5 + 7) = 0xd;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  lhs = (ExprBase *)CONCAT44(extraout_var_02,iVar3);
  pTVar6 = ExpressionContext::GetReferenceType(ctx,ctx->typeFunctionID);
  lhs->typeID = 0x1b;
  lhs->source = source;
  lhs->type = &pTVar6->super_TypeBase;
  lhs->next = (ExprBase *)0x0;
  lhs->listed = false;
  lhs->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240ee0;
  lhs[1]._vptr_ExprBase = (_func_int **)CONCAT44(extraout_var,iVar2);
  *(undefined8 **)&lhs[1].typeID = puVar5;
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
  rhs = (ExprBase *)CONCAT44(extraout_var_03,iVar2);
  pTVar1 = ctx->typeFunctionID;
  rhs->typeID = 10;
  rhs->source = source;
  rhs->type = pTVar1;
  rhs->next = (ExprBase *)0x0;
  rhs->listed = false;
  rhs->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240588;
  rhs[1]._vptr_ExprBase = (_func_int **)function;
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  ExprAssignment::ExprAssignment
            ((ExprAssignment *)CONCAT44(extraout_var_04,iVar2),source,ctx->typeFunctionID,lhs,rhs);
  return &((ExprAssignment *)CONCAT44(extraout_var_04,iVar2))->super_ExprBase;
}

Assistant:

ExprBase* CreateVirtualTableAssignment(ExpressionContext &ctx, SynBase *source, VariableData *vtable, TypeBase *type, FunctionData *function)
{
	ExprBase *vtableAccess = new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, vtable->type, vtable);

	ExprBase *typeId = new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, type);

	ExprBase *typeIdInt = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.typeInt, typeId, EXPR_CAST_REINTERPRET);

	ExprArrayIndex *arraySlot = new (ctx.get<ExprArrayIndex>()) ExprArrayIndex(source, ctx.GetReferenceType(ctx.typeFunctionID), vtableAccess, typeIdInt);

	ExprBase *rhs = new (ctx.get<ExprFunctionIndexLiteral>()) ExprFunctionIndexLiteral(source, ctx.typeFunctionID, function);

	ExprBase *assignment = new (ctx.get<ExprAssignment>()) ExprAssignment(source, ctx.typeFunctionID, arraySlot, rhs);

	return assignment;
}